

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CascRootFile_MNDX.cpp
# Opt level: O3

LPBYTE __thiscall TRootHandler_MNDX::Search(TRootHandler_MNDX *this,TCascSearch *hs)

{
  TMndxMarFile *this_00;
  bool bVar1;
  TMndxSearch *pSearch;
  LPBYTE pBVar2;
  bool bFindResult;
  bool local_39;
  TRootHandler_MNDX *local_38;
  
  this_00 = (this->MndxInfo).MarFiles[2];
  local_39 = false;
  pSearch = (TMndxSearch *)hs->pRootContext;
  local_38 = this;
  if (pSearch == (TMndxSearch *)0x0) {
    pSearch = (TMndxSearch *)operator_new(0x30);
    pSearch->pStruct40 = (TStruct40 *)0x0;
    pSearch->szFoundPath = (char *)0x0;
    pSearch->cchFoundPath = 0;
    pSearch->FileNameIndex = 0;
    pSearch->szSearchMask = "";
    pSearch->cchSearchMask = 0;
    hs->pRootContext = pSearch;
  }
  do {
    TMndxMarFile::DoSearch(this_00,pSearch,&local_39);
    if (local_39 == false) {
      return (LPBYTE)0x0;
    }
    if ((hs->szMask == (char *)0x0) || (*hs->szMask == '\0')) break;
    memcpy(hs->szFileName,pSearch->szFoundPath,pSearch->cchFoundPath);
    hs->szFileName[pSearch->cchFoundPath] = '\0';
    bVar1 = CheckWildCard(hs->szFileName,hs->szMask);
  } while (!bVar1);
  pBVar2 = FillFindData(local_38,hs,pSearch);
  return pBVar2;
}

Assistant:

LPBYTE Search(TCascSearch * hs)
    {
        TMndxMarFile * pMarFile = MndxInfo.MarFiles[2];
        TMndxSearch * pSearch = NULL;
        bool bFindResult = false;

        // If the first time, allocate the structure for the search result
        if(hs->pRootContext == NULL)
        {
            // Create the new search structure
            pSearch = new TMndxSearch;
            if(pSearch == NULL)
                return NULL;

            // Setup the search mask
            pSearch->SetSearchMask("", 0);
            hs->pRootContext = pSearch;
        }

        // Make shortcut for the search structure
        assert(hs->pRootContext != NULL);
        pSearch = (TMndxSearch *)hs->pRootContext;

        // Keep searching
        for(;;)
        {
            // Search the next file name
            pMarFile->DoSearch(pSearch, &bFindResult);
            if (bFindResult == false)
                return NULL;

            // If we have no wild mask, we found it
            if (hs->szMask == NULL || hs->szMask[0] == 0)
                break;

            // Copy the found name to the buffer
            memcpy(hs->szFileName, pSearch->szFoundPath, pSearch->cchFoundPath);
            hs->szFileName[pSearch->cchFoundPath] = 0;
            if (CheckWildCard(hs->szFileName, hs->szMask))
                break;
        }

        // Give the file size and CKey
        return FillFindData(hs, pSearch);
    }